

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

int __thiscall testing::internal::UnitTestImpl::successful_test_case_count(UnitTestImpl *this)

{
  pointer ppTVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  pointer ppTVar5;
  
  ppTVar1 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar4 = 0;
  for (ppTVar5 = (this->test_cases_).
                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppTVar5 != ppTVar1; ppTVar5 = ppTVar5 + 1
      ) {
    uVar3 = 0;
    if ((*ppTVar5)->should_run_ == true) {
      iVar2 = TestCase::failed_test_count(*ppTVar5);
      uVar3 = (uint)(iVar2 < 1);
    }
    iVar4 = iVar4 + uVar3;
  }
  return iVar4;
}

Assistant:

int UnitTestImpl::successful_test_case_count() const {
  return CountIf(test_cases_, TestCasePassed);
}